

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_coinvl.c
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  void *__ptr;
  FILE *pFVar4;
  size_t sVar5;
  ulong uVar6;
  char *__format;
  char **ppcVar7;
  
  if (argc < 2) {
    printf("Usage:\n\tmm_coinvl mm_table_%02x.bin [outputfile.bin]\n",0x32);
    return -1;
  }
  pcVar3 = table_to_string('2');
  printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar3,0x32,0x32);
  __ptr = calloc(1,0x68);
  if (__ptr == (void *)0x0) {
    printf("Failed to allocate %zu bytes.\n",0x68);
    return -0xc;
  }
  pFVar4 = fopen(argv[1],"rb");
  if (pFVar4 == (FILE *)0x0) {
    pcVar3 = argv[1];
    __format = "Error opening %s\n";
LAB_001044f8:
    printf(__format,pcVar3);
    free(__ptr);
    iVar2 = -2;
  }
  else {
    iVar2 = mm_validate_table_fsize('2',(FILE *)pFVar4,0x68);
    if (iVar2 == 0) {
      sVar5 = fread(__ptr,0x68,1,pFVar4);
      if (sVar5 == 1) {
        fclose(pFVar4);
        printf(
              "+---------------------------------------------+\n|  # | Coin Type         | Val | Vol | Params |\n+----+-------------------+-----+-----+--------+"
              );
        ppcVar7 = str_coin_name;
        uVar6 = 0;
        do {
          uVar1 = uVar6 + 1;
          printf("\n| %2d | %s | %3d | %3d |     %2d |",uVar1 & 0xffffffff,*ppcVar7,
                 (ulong)*(ushort *)((long)__ptr + uVar6 * 2),
                 (ulong)*(ushort *)((long)__ptr + uVar6 * 2 + 0x20),
                 (ulong)*(byte *)((long)__ptr + uVar6 + 0x40));
          ppcVar7 = ppcVar7 + 1;
          uVar6 = uVar1;
        } while (uVar1 != 0x10);
        puts("\n+---------------------------------------------+");
        iVar2 = 0;
        printf("|           Cash Box Volume:   %5d          |\n",
               (ulong)*(ushort *)((long)__ptr + 0x50));
        printf("|             Escrow Volume:   %5d          |\n",
               (ulong)*(ushort *)((long)__ptr + 0x52));
        printf("| Cash Box Volume Threshold:   %5d          |\n",
               (ulong)*(ushort *)((long)__ptr + 0x54));
        printf("|  Cash Box Value Threshold: $%6.2f          |\n",
               (double)*(uint *)((long)__ptr + 0x56) / 100.0);
        printf("|   Escrow Volume Threshold:   %5d          |\n",
               (ulong)*(ushort *)((long)__ptr + 0x5a));
        printf("|    Escrow Value Threshold: $%6.2f          |\n",
               (double)*(uint *)((long)__ptr + 0x5c) / 100.0);
        puts("+---------------------------------------------+");
        *(undefined1 *)((long)__ptr + 0x48) = 3;
        *(undefined1 *)((long)__ptr + 0x44) = 3;
        *(undefined4 *)((long)__ptr + 0x40) = 0x3030303;
        *(undefined8 *)((long)__ptr + 0x10) = 0x19000a00050064;
        *(undefined8 *)((long)__ptr + 0x30) = 0x19000a00140028;
        *(undefined1 *)((long)__ptr + 0x49) = 3;
        *(undefined2 *)((long)__ptr + 0x4a) = 0x303;
        *(undefined1 *)((long)__ptr + 0x4d) = 3;
        *(undefined2 *)((long)__ptr + 0x1a) = 100;
        *(undefined2 *)((long)__ptr + 0x3a) = 0x28;
        if (argc == 2) {
LAB_001044c8:
          free(__ptr);
          return iVar2;
        }
        pFVar4 = fopen(argv[2],"wb");
        pcVar3 = argv[2];
        if (pFVar4 != (FILE *)0x0) {
          iVar2 = 0;
          printf("\nWriting new table to %s\n",pcVar3);
          sVar5 = fwrite(__ptr,0x68,1,pFVar4);
          if (sVar5 != 1) {
            printf("Error writing output file %s\n",argv[2]);
            iVar2 = -5;
          }
          fclose(pFVar4);
          goto LAB_001044c8;
        }
        __format = "Error opening output file %s for write.\n";
        goto LAB_001044f8;
      }
      pcVar3 = table_to_string('2');
      printf("Error reading %s table.\n",pcVar3);
    }
    free(__ptr);
    fclose(pFVar4);
    iVar2 = -5;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   coin_index;
    int   ret = 0;

    dlog_mt_coin_val_table_t *ptable;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_coinvl mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    ptable = (dlog_mt_coin_val_table_t *)calloc(1, sizeof(dlog_mt_coin_val_table_t));

    if (ptable == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_coin_val_table_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(ptable);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_coin_val_table_t)) != 0) {
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    if (fread(ptable, sizeof(dlog_mt_coin_val_table_t), 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+---------------------------------------------+\n" \
           "|  # | Coin Type         | Val | Vol | Params |\n" \
           "+----+-------------------+-----+-----+--------+");

    for (coin_index = 0; coin_index < COIN_TYPES_MAX; coin_index++) {
        printf("\n| %2d | %s | %3d | %3d |     %2d |",
               coin_index + 1,
               str_coin_name[coin_index],
               LE16(ptable->coin_value[coin_index]),
               LE16(ptable->coin_volume[coin_index]),
               ptable->coin_param[coin_index]);
    }

    printf("\n+---------------------------------------------+\n");

    printf("|           Cash Box Volume:   %5d          |\n",    LE16(ptable->cash_box_volume));
    printf("|             Escrow Volume:   %5d          |\n",    LE16(ptable->escrow_volume));
    printf("| Cash Box Volume Threshold:   %5d          |\n",    LE16(ptable->cash_box_volume_threshold));
    printf("|  Cash Box Value Threshold: $%6.2f          |\n",   (float)(LE32(ptable->cash_box_value_threshold)) / 100.0);
    printf("|   Escrow Volume Threshold:   %5d          |\n",    ptable->escrow_volume_threshold);
    printf("|    Escrow Value Threshold: $%6.2f          |\n", (float)(LE32(ptable->escrow_value_threshold)) / 100.0);
    printf("+---------------------------------------------+\n");

    ptable->coin_param[cdn_nickel]  = 0x03;
    ptable->coin_param[cdn_nickel2] = 0x03;
    ptable->coin_param[cdn_dime]    = 0x03;
    ptable->coin_param[cdn_quarter] = 0x03;
    ptable->coin_param[cdn_dollar]  = 0x03;

    /* Add coin params for US Dollar */
    ptable->coin_param[us_dollar]  = 0x03;
    ptable->coin_value[us_dollar]  = LE16(100);
    ptable->coin_volume[us_dollar] = LE16(40);

    /* Add coin params for Canadian Steel nickel, dime, quarter */
    ptable->coin_param[cdn_steel_nickel]  = 0x03;
    ptable->coin_value[cdn_steel_nickel]  = LE16(5);
    ptable->coin_volume[cdn_steel_nickel] = LE16(20);

    ptable->coin_param[cdn_steel_dime]  = 0x03;
    ptable->coin_value[cdn_steel_dime]  = LE16(10);
    ptable->coin_volume[cdn_steel_dime] = LE16(10);

    ptable->coin_param[cdn_steel_quarter]  = 0x03;
    ptable->coin_value[cdn_steel_quarter]  = LE16(25);
    ptable->coin_volume[cdn_steel_quarter] = LE16(25);

    /* Add coin params for New Canadian Dollar coin */
    ptable->coin_param[cdn_dollar2]  = 0x03;
    ptable->coin_value[cdn_dollar2]  = LE16(100);
    ptable->coin_volume[cdn_dollar2] = LE16(40);

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            free(ptable);
            return -ENOENT;
        }
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(ptable, sizeof(dlog_mt_coin_val_table_t), 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (ptable != NULL) {
        free(ptable);
    }

    return ret;
}